

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

uint openjtalk_getSamplingFrequency(OpenJTalk *oj)

{
  size_t sVar1;
  ulong uVar2;
  long in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  double res;
  _Bool error;
  Open_JTalk *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    local_4 = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    sVar1 = Open_JTalk_get_sampling_frequency(in_stack_ffffffffffffffd8,(_Bool *)0x19a67c);
    auVar4._8_4_ = (int)(sVar1 >> 0x20);
    auVar4._0_8_ = sVar1;
    auVar4._12_4_ = 0x45300000;
    dVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
    if ((local_11 & 1) == 0) {
      uVar2 = (ulong)dVar3;
      *(ulong *)(in_RDI + 0x638) =
           uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
      local_4 = (uint)*(undefined8 *)(in_RDI + 0x638);
    }
    else {
      *(undefined4 *)(in_RDI + 0x678) = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getSamplingFrequency(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	bool error;
	double res = Open_JTalk_get_sampling_frequency(oj->open_jtalk, &error);
	if (error)
	{
		oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}
	oj->sampling_frequency = res;
	return oj->sampling_frequency;
}